

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution.cpp
# Opt level: O3

int __thiscall
ncnn::Deconvolution::forward(Deconvolution *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  size_t sVar9;
  int *piVar10;
  void *pvVar11;
  size_t sVar12;
  size_t sVar13;
  void *pvVar14;
  float *pfVar15;
  bool bVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  long lVar21;
  undefined4 in_EAX;
  int iVar22;
  uint uVar23;
  int iVar24;
  ulong uVar25;
  int iVar26;
  ulong uVar27;
  int iVar28;
  ulong uVar29;
  void *pvVar30;
  long lVar31;
  void *pvVar32;
  bool bVar33;
  undefined4 uVar34;
  float fVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  int iVar39;
  undefined1 auVar38 [16];
  float fVar40;
  float fVar41;
  int iVar42;
  int iVar44;
  undefined1 auVar43 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  int size;
  vector<int,_std::allocator<int>_> _space_ofs;
  allocator_type local_159;
  ulong local_158;
  Mat *local_150;
  long local_148;
  ulong local_140;
  ulong local_138;
  ulong local_130;
  void *local_128;
  long local_120;
  Mat local_118;
  undefined1 local_c8 [16];
  Option *local_b8;
  long local_b0;
  long local_a8;
  Mat *local_a0;
  ulong local_98;
  void *local_90;
  void *local_88;
  ulong local_80;
  ulong local_78;
  long local_70;
  void *local_68;
  long local_60;
  undefined1 local_58 [16];
  vector<int,_std::allocator<int>_> local_48;
  
  iVar2 = bottom_blob->w;
  iVar39 = bottom_blob->h;
  iVar42 = this->kernel_w;
  iVar44 = this->dilation_w;
  sVar9 = bottom_blob->elemsize;
  iVar24 = this->stride_w;
  iVar26 = this->kernel_h;
  iVar28 = this->dilation_h;
  iVar3 = this->stride_h;
  iVar4 = this->output_pad_right;
  iVar5 = this->output_pad_bottom;
  local_118.cstep = 0;
  local_118.data = (void *)0x0;
  local_118.refcount._0_4_ = 0;
  local_118.refcount._4_4_ = 0;
  local_118.elemsize = 0;
  local_118.elempack = 0;
  local_118.allocator = (Allocator *)0x0;
  local_118.dims = 0;
  local_118.w = 0;
  local_118.h = 0;
  local_118.d = 0;
  local_118.c = 0;
  auVar36._0_4_ = -(uint)(0 < this->pad_left);
  auVar36._4_4_ = -(uint)(0 < this->pad_right);
  auVar36._8_4_ = -(uint)(0 < this->pad_top);
  auVar36._12_4_ = -(uint)(0 < this->pad_bottom);
  iVar22 = movmskps(in_EAX,auVar36);
  lVar31 = 0x10;
  if ((iVar22 == 0) &&
     (((this->output_w < 1 || (this->output_h < 1)) && (lVar31 = 8, &local_118 != top_blob)))) {
    piVar10 = top_blob->refcount;
    if (piVar10 != (int *)0x0) {
      LOCK();
      *piVar10 = *piVar10 + 1;
      UNLOCK();
    }
    local_118.data = top_blob->data;
    local_118.refcount._0_4_ = SUB84(top_blob->refcount,0);
    local_118.refcount._4_4_ = (undefined4)((ulong)top_blob->refcount >> 0x20);
    local_118.elemsize = top_blob->elemsize;
    local_118.elempack = top_blob->elempack;
    local_118.allocator = top_blob->allocator;
    uVar17 = top_blob->dims;
    uVar18 = top_blob->w;
    uVar19 = top_blob->h;
    uVar20 = top_blob->d;
    local_118.c = top_blob->c;
    local_118.cstep = top_blob->cstep;
    local_118.dims = uVar17;
    local_118.w = uVar18;
    local_118.h = uVar19;
    local_118.d = uVar20;
  }
  local_150 = top_blob;
  local_b8 = opt;
  local_a0 = bottom_blob;
  Mat::create(&local_118,iVar4 + (iVar42 + -1) * iVar44 + (iVar2 + -1) * iVar24 + 1,
              iVar5 + 1 + (iVar26 + -1) * iVar28 + (iVar39 + -1) * iVar3,this->num_output,sVar9,
              *(Allocator **)(&opt->lightmode + lVar31));
  iVar2 = local_118.w;
  iVar39 = -100;
  if ((local_118.data != (void *)0x0) &&
     (local_b0 = (long)local_118.c, local_118.cstep * local_b0 != 0)) {
    uVar6 = this->kernel_w;
    iVar39 = this->kernel_h;
    local_60 = (long)this->stride_w;
    local_120 = (long)this->stride_h;
    iVar42 = this->dilation_w;
    iVar44 = this->dilation_h;
    local_158 = (ulong)(uint)this->activation_type;
    uVar23 = uVar6 * iVar39;
    std::vector<int,_std::allocator<int>_>::vector(&local_48,(long)(int)uVar23,&local_159);
    if (0 < iVar39) {
      iVar24 = 0;
      iVar26 = 0;
      iVar28 = 0;
      do {
        if (0 < (int)uVar6) {
          lVar31 = 0;
          do {
            local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[iVar24 + lVar31] = iVar26;
            iVar26 = iVar26 + iVar42;
            lVar31 = lVar31 + 1;
          } while (uVar6 != (uint)lVar31);
          iVar24 = iVar24 + (uint)lVar31;
        }
        iVar26 = iVar26 + (iVar2 * iVar44 - iVar42 * uVar6);
        iVar28 = iVar28 + 1;
      } while (iVar28 != iVar39);
    }
    local_140 = (ulong)uVar6;
    if (0 < (int)local_b0) {
      local_a8 = local_118.cstep * local_118.elemsize;
      lVar31 = (long)local_118.h * (long)local_118.w;
      local_138 = 0;
      local_90 = (this->bias_data).data;
      bVar33 = local_90 != (void *)0x0;
      iVar2 = (this->bias_data).c;
      sVar9 = (this->bias_data).cstep;
      iVar42 = (int)((local_118.elemsize * lVar31 + 0xf & 0xfffffffffffffff0) / local_118.elemsize);
      if (local_118.dims == 4) {
        iVar42 = (int)lVar31;
      }
      local_78 = (ulong)(uint)(iVar42 * local_118.d);
      uVar7 = local_a0->w;
      local_98 = (ulong)(uint)local_a0->h;
      uVar8 = local_a0->c;
      local_130 = (ulong)(uint)(local_118.h * local_118.w);
      local_120 = local_120 * local_118.w * local_118.elemsize;
      local_80 = (ulong)(iVar42 * local_118.d + 3U & 0xfffffffc);
      lVar31 = local_78 - 1;
      auVar43._8_4_ = (int)lVar31;
      auVar43._0_8_ = lVar31;
      auVar43._12_4_ = (int)((ulong)lVar31 >> 0x20);
      lVar31 = (long)local_118.data + 0xc;
      local_140 = (ulong)(uVar6 * iVar39 * uVar8);
      auVar43 = auVar43 ^ _DAT_005130e0;
      local_158 = (ulong)((int)local_158 - 1);
      local_88 = local_118.data;
      local_148 = 0;
      pvVar30 = local_118.data;
      auVar36 = _DAT_005131e0;
      auVar45 = _DAT_005131f0;
      auVar46 = _DAT_005130e0;
      local_58 = auVar43;
      do {
        uVar34 = 0;
        if ((long)iVar2 * sVar9 != 0 && bVar33) {
          uVar34 = *(undefined4 *)((long)local_90 + local_148 * 4);
        }
        if (0 < (int)local_78) {
          uVar25 = 0;
          do {
            auVar37._8_4_ = (int)uVar25;
            auVar37._0_8_ = uVar25;
            auVar37._12_4_ = (int)(uVar25 >> 0x20);
            auVar38 = (auVar37 | auVar45) ^ auVar46;
            iVar42 = auVar43._0_4_;
            bVar16 = iVar42 < auVar38._0_4_;
            iVar39 = auVar38._4_4_;
            iVar44 = auVar43._4_4_;
            if ((bool)(~(iVar44 < iVar39 || iVar39 == iVar44 && bVar16) & 1)) {
              *(undefined4 *)(lVar31 + -0xc + uVar25 * 4) = uVar34;
            }
            if (iVar44 >= iVar39 && (iVar39 != iVar44 || !bVar16)) {
              *(undefined4 *)(lVar31 + -8 + uVar25 * 4) = uVar34;
            }
            auVar37 = (auVar37 | auVar36) ^ auVar46;
            iVar39 = auVar37._4_4_;
            if (iVar39 <= iVar44 && (iVar39 != iVar44 || auVar37._0_4_ <= iVar42)) {
              *(undefined4 *)(lVar31 + -4 + uVar25 * 4) = uVar34;
              *(undefined4 *)(lVar31 + uVar25 * 4) = uVar34;
            }
            uVar25 = uVar25 + 4;
          } while (local_80 != uVar25);
        }
        if (0 < (int)local_98) {
          local_68 = (void *)(local_a8 * local_148 + (long)local_88);
          pvVar11 = (this->weight_data).data;
          auVar38._8_8_ = 0;
          auVar38._0_8_ = local_c8._8_8_;
          local_c8 = auVar38 << 0x40;
          do {
            if (0 < (int)uVar7) {
              iVar39 = local_a0->w;
              sVar12 = local_a0->elemsize;
              sVar13 = local_a0->cstep;
              pvVar14 = local_a0->data;
              uVar25 = 0;
              do {
                if (0 < (int)uVar8) {
                  lVar21 = uVar25 * local_60 * 4 + local_120 * local_c8._0_8_;
                  uVar27 = 0;
                  pvVar32 = (void *)((long)(int)local_138 * 4 + (long)pvVar11);
                  do {
                    if (0 < (int)uVar23) {
                      fVar35 = *(float *)((long)pvVar14 +
                                         sVar13 * sVar12 * uVar27 +
                                         uVar25 * 4 + (long)iVar39 * local_c8._0_8_ * sVar12);
                      uVar29 = 0;
                      do {
                        *(float *)((long)local_68 +
                                  (long)local_48.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start[uVar29] * 4 +
                                  lVar21) =
                             *(float *)((long)pvVar32 + uVar29 * 4) * fVar35 +
                             *(float *)((long)local_68 +
                                       (long)local_48.super__Vector_base<int,_std::allocator<int>_>.
                                             _M_impl.super__Vector_impl_data._M_start[uVar29] * 4 +
                                       lVar21);
                        uVar29 = uVar29 + 1;
                      } while (uVar23 != uVar29);
                    }
                    uVar27 = uVar27 + 1;
                    pvVar32 = (void *)((long)pvVar32 + (long)(int)uVar23 * 4);
                  } while (uVar27 != uVar8);
                }
                uVar25 = uVar25 + 1;
              } while (uVar25 != uVar7);
            }
            uVar25 = local_c8._0_8_ + 1;
            local_c8._0_8_ = uVar25;
          } while (uVar25 != local_98);
        }
        local_128 = pvVar30;
        local_70 = lVar31;
        if (0 < (int)local_130) {
          pfVar15 = (float *)(this->activation_params).data;
          uVar29 = 0;
          uVar25 = local_158;
          uVar27 = local_130;
          do {
            fVar35 = *(float *)((long)pvVar30 + uVar29 * 4);
            fVar41 = fVar35;
            if ((uint)uVar25 < 6) {
              switch((long)&switchD_00297f35::switchdataD_00518960 +
                     (long)(int)(&switchD_00297f35::switchdataD_00518960)[uVar25]) {
              case 0x297f37:
                if (fVar35 <= 0.0) {
                  fVar41 = 0.0;
                }
                break;
              case 0x297f47:
                local_c8 = ZEXT416((uint)fVar35);
                fVar35 = expf(fVar35);
                fVar35 = logf(fVar35 + 1.0);
                fVar35 = tanhf(fVar35);
                pvVar30 = local_128;
                uVar25 = local_158;
                uVar27 = local_130;
                auVar43 = local_58;
                auVar36 = _DAT_005131e0;
                auVar45 = _DAT_005131f0;
                auVar46 = _DAT_005130e0;
                fVar41 = fVar35 * (float)local_c8._0_4_;
                break;
              case 0x297fb3:
                if (fVar35 <= *pfVar15) {
                  fVar35 = *pfVar15;
                }
                fVar41 = pfVar15[1];
                if (fVar35 <= pfVar15[1]) {
                  fVar41 = fVar35;
                }
                break;
              case 0x297fd2:
                if (88.37626 <= fVar35) {
                  fVar35 = 88.37626;
                }
                fVar35 = expf((float)(-(uint)(fVar35 < -88.37626) & 0x42b0c0a5 |
                                     ~-(uint)(fVar35 < -88.37626) & ((uint)fVar35 ^ auVar46._0_4_)))
                ;
                pvVar30 = local_128;
                uVar25 = local_158;
                uVar27 = local_130;
                auVar43 = local_58;
                auVar36 = _DAT_005131e0;
                auVar45 = _DAT_005131f0;
                auVar46 = _DAT_005130e0;
                fVar41 = 1.0 / (fVar35 + 1.0);
                break;
              case 0x298053:
                fVar41 = (float)(~-(uint)(0.0 < fVar35) & (uint)*pfVar15 |
                                -(uint)(0.0 < fVar35) & 0x3f800000) * fVar35;
                break;
              case 0x29807f:
                fVar1 = *pfVar15;
                fVar40 = (float)((uint)pfVar15[1] ^ auVar46._0_4_) / fVar1;
                fVar41 = 0.0;
                if ((fVar40 <= fVar35) && (fVar41 = fVar35, fVar35 <= fVar40 + 1.0 / fVar1)) {
                  fVar41 = (fVar1 * fVar35 + pfVar15[1]) * fVar35;
                }
              }
            }
            *(float *)((long)pvVar30 + uVar29 * 4) = fVar41;
            uVar29 = uVar29 + 1;
          } while (uVar27 != uVar29);
        }
        local_148 = local_148 + 1;
        lVar31 = local_70 + local_a8;
        local_138 = (ulong)(uint)((int)local_138 + (int)local_140);
        pvVar30 = (void *)((long)pvVar30 + local_a8);
      } while (local_148 != local_b0);
    }
    if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    cut_padding(this,&local_118,local_150,local_b8);
    if ((local_150->data == (void *)0x0) || (iVar39 = 0, (long)local_150->c * local_150->cstep == 0)
       ) {
      iVar39 = -100;
    }
  }
  piVar10 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
  if (piVar10 != (int *)0x0) {
    LOCK();
    *piVar10 = *piVar10 + -1;
    UNLOCK();
    if (*piVar10 == 0) {
      if (local_118.allocator == (Allocator *)0x0) {
        if (local_118.data != (void *)0x0) {
          free(local_118.data);
        }
      }
      else {
        (*(local_118.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar39;
}

Assistant:

int Deconvolution::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;
    int outh = (h - 1) * stride_h + kernel_extent_h + output_pad_bottom;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || (output_w > 0 && output_h > 0))
    {
        top_blob_bordered.create(outw, outh, num_output, elemsize, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    int ret = deconvolution(bottom_blob, top_blob_bordered, weight_data, bias_data, kernel_w, kernel_h, stride_w, stride_h, dilation_w, dilation_h, activation_type, activation_params, opt);
    if (ret != 0)
        return ret;

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}